

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O1

void __thiscall xray_re::se_monster::state_write(se_monster *this,xr_packet *packet)

{
  byte bVar1;
  ushort uVar2;
  
  cse_alife_monster_base::state_write(&this->super_cse_alife_monster_base,packet);
  uVar2 = *(ushort *)
           &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
            super_cse_alife_creature_abstract.field_0x28;
  if (0x7f < uVar2) {
    if (uVar2 != 0x80) {
      __assert_fail("m_version <= CSE_VERSION_COP",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x12e,"virtual void xray_re::se_monster::state_write(xr_packet &)");
    }
    (*packet->_vptr_xr_packet[4])(packet,&this->m_off_level_vertex_id);
    (*packet->_vptr_xr_packet[4])(packet,&this->m_active_section);
    return;
  }
  if (uVar2 < 0x7a) {
    if (uVar2 == 0x65) {
      if (*(ushort *)
           &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
            super_cse_alife_creature_abstract.field_0x2a < 2) {
        return;
      }
    }
    else {
      if (uVar2 != 0x76) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x145,"virtual void xray_re::se_monster::state_write(xr_packet &)");
      }
      if (2 < *(ushort *)
               &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
                super_cse_alife_creature_abstract.field_0x2a) {
        (*packet->_vptr_xr_packet[10])
                  (packet,(ulong)(byte)(this->super_cse_alife_monster_base).super_cse_ph_skeleton.
                                       field_0x2e);
      }
      if (*(ushort *)
           &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
            super_cse_alife_creature_abstract.field_0x2a < 5) {
        return;
      }
    }
    bVar1 = (this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2f;
  }
  else {
    if (0x7c < uVar2) {
      __assert_fail("m_version <= CSE_VERSION_CS",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x134,"virtual void xray_re::se_monster::state_write(xr_packet &)");
    }
    (*packet->_vptr_xr_packet[10])
              (packet,(ulong)(byte)(this->super_cse_alife_monster_base).super_cse_ph_skeleton.
                                   field_0x2e);
    if (2 < (byte)(this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2e) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x137,"virtual void xray_re::se_monster::state_write(xr_packet &)");
    }
    if (6 < *(ushort *)
             &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
              super_cse_alife_creature_abstract.field_0x2a) {
      (*packet->_vptr_xr_packet[4])(packet,&this->m_squad_id);
    }
    if (*(ushort *)
         &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
          super_cse_alife_creature_abstract.field_0x2a < 8) {
      return;
    }
    bVar1 = this->m_sim_forced_online;
  }
  (*packet->_vptr_xr_packet[0xc])(packet,(ulong)bVar1);
  return;
}

Assistant:

void se_monster::state_write(xr_packet& packet)
{
	cse_alife_monster_base::state_write(packet);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);

		packet.w_sz(m_off_level_vertex_id);
		packet.w_sz(m_active_section);
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);
		packet.w_u8(m_job_online);
		if (m_job_online > 2)
			xr_not_expected();
		if (m_script_version >= 7)
			packet.w_sz(m_squad_id);
		if (m_script_version >= 8)
			packet.w_bool(m_sim_forced_online);
	} else if (m_version == CSE_VERSION_SOC) {
		if (m_script_version >= 3)
			packet.w_u8(m_job_online);
		if (m_script_version >= 5)
			packet.w_bool(m_was_in_smart_terrain);
	} else if (m_version == CSE_VERSION_2215) {
		if (m_script_version >= 2)
			packet.w_bool(m_was_in_smart_terrain);
	} else {
		xr_not_implemented();
	}
}